

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

UpVal ** getupvalref(lua_State *L,int fidx,int n,LClosure **pf)

{
  LClosure *pLVar1;
  TValue *pTVar2;
  TValue *fi;
  LClosure *f;
  LClosure **pf_local;
  int n_local;
  int fidx_local;
  lua_State *L_local;
  
  pTVar2 = index2value(L,fidx);
  pLVar1 = (LClosure *)(pTVar2->value_).f;
  if (pf != (LClosure **)0x0) {
    *pf = pLVar1;
  }
  if ((n < 1) || (pLVar1->p->sizeupvalues < n)) {
    L_local = (lua_State *)&getupvalref::nullup;
  }
  else {
    L_local = (lua_State *)(pLVar1->upvals + (n + -1));
  }
  return (UpVal **)L_local;
}

Assistant:

static UpVal **getupvalref (lua_State *L, int fidx, int n, LClosure **pf) {
  static const UpVal *const nullup = NULL;
  LClosure *f;
  TValue *fi = index2value(L, fidx);
  api_check(L, ttisLclosure(fi), "Lua function expected");
  f = clLvalue(fi);
  if (pf) *pf = f;
  if (1 <= n && n <= f->p->sizeupvalues)
    return &f->upvals[n - 1];  /* get its upvalue pointer */
  else
    return (UpVal**)&nullup;
}